

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
PhyloTree::getFirstCommonEdge
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
          vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a;
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  int iVar4;
  edge_not_found_exception *this;
  pointer this_00;
  PhyloTreeEdge *this_01;
  Bipartition *__return_storage_ptr___00;
  pointer this_02;
  double dVar5;
  allocator local_d9;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_d8;
  PhyloTreeEdge *local_d0;
  string local_c8;
  Bipartition local_a8;
  Bipartition local_80;
  Bipartition local_58;
  
  local_d0 = (PhyloTreeEdge *)__return_storage_ptr__;
  std::
  __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  this_02 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar1 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar2 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_d8 = t1_edges;
  while( true ) {
    b = &(this_00->super_Bipartition).partition;
    while( true ) {
      if ((this_02 == pPVar1) || (this_00 == pPVar2)) {
        this = (edge_not_found_exception *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_c8,"No common edges",&local_d9);
        edge_not_found_exception::edge_not_found_exception(this,&local_c8);
        __cxa_throw(this,&edge_not_found_exception::typeinfo,std::runtime_error::~runtime_error);
      }
      a = &(this_02->super_Bipartition).partition;
      bVar3 = boost::operator<(a,b);
      if (!bVar3) break;
      bVar3 = PhyloTreeEdge::isCompatibleWith(this_02,t2_edges);
      if (bVar3) {
        __return_storage_ptr___00 = &local_58;
        PhyloTreeEdge::asSplit(__return_storage_ptr___00,this_02);
        dVar5 = PhyloTreeEdge::getAttribute(this_02);
        this_01 = local_d0;
        iVar4 = PhyloTreeEdge::getOriginalID(this_02);
        PhyloTreeEdge::PhyloTreeEdge(this_01,__return_storage_ptr___00,dVar5,iVar4);
        goto LAB_0012a470;
      }
      this_02 = this_02 + 1;
    }
    bVar3 = boost::operator<(b,a);
    if (!bVar3) break;
    bVar3 = PhyloTreeEdge::isCompatibleWith(this_00,local_d8);
    if (bVar3) {
      __return_storage_ptr___00 = &local_a8;
      PhyloTreeEdge::asSplit(__return_storage_ptr___00,this_00);
      dVar5 = PhyloTreeEdge::getAttribute(this_00);
      this_01 = local_d0;
      iVar4 = PhyloTreeEdge::getOriginalID(this_00);
      PhyloTreeEdge::PhyloTreeEdge(this_01,__return_storage_ptr___00,dVar5,iVar4);
LAB_0012a470:
      Bipartition::~Bipartition(__return_storage_ptr___00);
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01;
    }
    this_00 = this_00 + 1;
  }
  __return_storage_ptr___00 = &local_80;
  PhyloTreeEdge::asSplit(__return_storage_ptr___00,this_02);
  dVar5 = PhyloTreeEdge::getLength(this_02);
  this_01 = local_d0;
  local_d8 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             PhyloTreeEdge::getLength(this_00);
  iVar4 = PhyloTreeEdge::getOriginalID(this_02);
  PhyloTreeEdge::PhyloTreeEdge(this_01,__return_storage_ptr___00,dVar5 - (double)local_d8,iVar4);
  goto LAB_0012a470;
}

Assistant:

PhyloTreeEdge PhyloTree::getFirstCommonEdge(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges) {
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                return PhyloTreeEdge(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                return PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID());
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    return PhyloTreeEdge(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
    throw edge_not_found_exception("No common edges");
}